

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O3

Gia_Man_t *
Gia_ManIsoReduce(Gia_Man_t *pInit,Vec_Ptr_t **pvPosEquivs,Vec_Ptr_t **pvPiPerms,int fEstimate,
                int fDualOut,int fVerbose,int fVeryVerbose)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Gia_Man_t *pGVar6;
  Gia_Man_t *pGVar7;
  Vec_Ptr_t *pVVar8;
  int *piVar9;
  void *pvVar10;
  uint *puVar11;
  void *pvVar12;
  Vec_Str_t *__ptr;
  undefined8 *puVar13;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  int iVar14;
  uint uVar15;
  Vec_Int_t **pvPiPerm;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  Vec_Ptr_t **ppVVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  size_t sVar26;
  int iPo;
  timespec ts;
  uint local_e0;
  uint local_dc;
  int local_cc;
  Vec_Ptr_t *local_c8;
  Gia_Man_t *local_c0;
  ulong local_b8;
  int local_ac;
  ulong local_a8;
  Vec_Ptr_t **local_a0;
  ulong local_98;
  uint *local_90;
  int local_84;
  Vec_Ptr_t **local_80;
  Vec_Ptr_t *local_78;
  void *local_70;
  ulong local_68;
  timespec local_60;
  Gia_Man_t *local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  local_ac = fDualOut;
  local_84 = fVerbose;
  iVar2 = clock_gettime(3,&local_60);
  if (iVar2 < 0) {
    lVar22 = -1;
  }
  else {
    lVar22 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  if (pvPosEquivs != (Vec_Ptr_t **)0x0) {
    *pvPosEquivs = (Vec_Ptr_t *)0x0;
  }
  local_a0 = pvPiPerms;
  if (pvPiPerms != (Vec_Ptr_t **)0x0) {
    lVar24 = (long)pInit->vCos->nSize - (long)pInit->nRegs;
    pVVar4 = (Vec_Ptr_t *)malloc(0x10);
    iVar2 = (int)lVar24;
    iVar17 = 8;
    if (6 < iVar2 - 1U) {
      iVar17 = iVar2;
    }
    pVVar4->nCap = iVar17;
    if (iVar17 == 0) {
      ppvVar5 = (void **)0x0;
    }
    else {
      ppvVar5 = (void **)malloc((long)iVar17 << 3);
    }
    pVVar4->pArray = ppvVar5;
    pVVar4->nSize = iVar2;
    memset(ppvVar5,0,lVar24 * 8);
    *local_a0 = pVVar4;
  }
  ppVVar21 = local_a0;
  uVar3 = pInit->vCos->nSize - pInit->nRegs;
  if (local_ac == 0) {
    if (uVar3 == 1) goto LAB_0075a9ad;
    pVVar4 = Gia_IsoDeriveEquivPos(pInit,1,fVeryVerbose);
    local_c0 = pInit;
    if (pVVar4 == (Vec_Ptr_t *)0x0) {
      return (Gia_Man_t *)0x0;
    }
  }
  else {
    if ((uVar3 & 1) != 0) {
      __assert_fail("(Gia_ManPoNum(pInit) & 1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIso.c"
                    ,0x443,
                    "Gia_Man_t *Gia_ManIsoReduce(Gia_Man_t *, Vec_Ptr_t **, Vec_Ptr_t **, int, int, int, int)"
                   );
    }
    if (uVar3 == 2) goto LAB_0075a9ad;
    local_80 = pvPosEquivs;
    pGVar6 = Gia_ManTransformMiter(pInit);
    pGVar7 = Gia_ManSeqStructSweep(pGVar6,1,1,0);
    Gia_ManStop(pGVar6);
    pVVar4 = Gia_IsoDeriveEquivPos(pGVar7,1,fVeryVerbose);
    pvPosEquivs = local_80;
    ppVVar21 = local_a0;
    local_c0 = pGVar7;
    if (pVVar4 == (Vec_Ptr_t *)0x0) {
      Gia_ManStop(pGVar7);
      return (Gia_Man_t *)0x0;
    }
  }
  uVar3 = pVVar4->nSize;
  lVar24 = (long)(int)uVar3;
  if (lVar24 < 1) {
    uVar18 = 0;
    uVar23 = 0;
  }
  else {
    uVar18 = 0;
    uVar19 = 0;
    lVar20 = 0;
    uVar23 = 0;
    do {
      iVar2 = *(int *)((long)pVVar4->pArray[lVar20] + 4);
      if (1 < iVar2) {
        uVar18 = (ulong)(iVar2 + uVar19);
        uVar19 = iVar2 + uVar19;
      }
      uVar23 = (ulong)((int)uVar23 + (uint)(1 < iVar2));
      lVar20 = lVar20 + 1;
    } while (lVar24 != lVar20);
  }
  local_50 = pInit;
  local_48 = lVar22;
  printf("Reduced %d outputs to %d candidate   classes (%d outputs are in %d non-trivial classes).  "
         ,(ulong)(uint)(local_c0->vCos->nSize - local_c0->nRegs),(ulong)uVar3,uVar18,uVar23);
  iVar17 = 3;
  iVar2 = clock_gettime(3,&local_60);
  if (iVar2 < 0) {
    lVar22 = -1;
  }
  else {
    lVar22 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  lVar22 = lVar22 - local_48;
  Abc_Print(iVar17,"%s =","Time");
  Abc_Print(iVar17,"%9.2f sec\n",(double)lVar22 / 1000000.0);
  if (fEstimate != 0) {
    if (0 < (int)uVar3) {
      lVar22 = 0;
      do {
        pvVar12 = pVVar4->pArray[lVar22];
        if (pvVar12 != (void *)0x0) {
          if (*(void **)((long)pvVar12 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar12 + 8));
          }
          free(pvVar12);
        }
        lVar22 = lVar22 + 1;
      } while (lVar24 != lVar22);
    }
    if (pVVar4->pArray != (void **)0x0) {
      free(pVVar4->pArray);
    }
    free(pVVar4);
    pInit = local_50;
LAB_0075a9ad:
    pGVar6 = Gia_ManDup(pInit);
    return pGVar6;
  }
  local_80 = pvPosEquivs;
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar8->pArray = ppvVar5;
  uVar18 = (ulong)(uint)pVVar4->nSize;
  local_dc = 0;
  local_c8 = pVVar8;
  if (0 < pVVar4->nSize) {
    local_a8 = 100;
    uVar23 = 0;
    local_98 = 100;
    local_e0 = 0;
    lVar22 = 0;
    local_dc = 0;
    local_78 = pVVar4;
    do {
      pGVar6 = local_c0;
      pvVar12 = pVVar4->pArray[lVar22];
      iVar2 = *(int *)((long)pvVar12 + 4);
      local_b8 = uVar23;
      local_70 = pvVar12;
      local_38 = lVar22;
      if ((long)iVar2 < 2) {
        piVar9 = (int *)malloc(0x10);
        piVar9[1] = iVar2;
        *piVar9 = iVar2;
        if (iVar2 == 0) {
          sVar26 = 0;
          pvVar10 = (void *)0x0;
        }
        else {
          sVar26 = (long)iVar2 << 2;
          pvVar10 = malloc(sVar26);
        }
        uVar18 = local_a8;
        *(void **)(piVar9 + 2) = pvVar10;
        memcpy(pvVar10,*(void **)((long)pvVar12 + 8),sVar26);
        iVar2 = (int)local_b8;
        iVar17 = (int)uVar18;
        if (iVar2 == iVar17) {
          if (iVar17 < 0x10) {
            if (pVVar8->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar8->pArray,0x80);
            }
            pVVar8->pArray = ppvVar5;
            pVVar8->nCap = 0x10;
            uVar18 = 0x10;
          }
          else {
            uVar18 = (ulong)(uint)(iVar17 * 2);
            if (pVVar8->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(uVar18 * 8);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar8->pArray,uVar18 * 8);
            }
            pVVar8->pArray = ppvVar5;
            pVVar8->nCap = iVar17 * 2;
          }
        }
        else {
          ppvVar5 = pVVar8->pArray;
        }
        local_e0 = iVar2 + 1;
        uVar23 = (ulong)local_e0;
        pVVar8->nSize = local_e0;
        ppvVar5[iVar2] = piVar9;
        iVar2 = *(int *)((long)local_70 + 4);
        pVVar4 = local_78;
        local_a8 = uVar18;
        if (0 < iVar2) {
          iVar17 = 0;
          do {
            iVar14 = local_dc * -0x3d70a3d7;
            local_dc = local_dc + 1;
            uVar3 = iVar14 + 0xc7ae1479;
            if ((uVar3 >> 2 | uVar3 * 0x40000000) < 0x28f5c29) {
              printf("%6d finished...\r",(ulong)local_dc);
              iVar2 = *(int *)((long)local_70 + 4);
            }
            iVar17 = iVar17 + 1;
            pVVar4 = local_78;
            uVar18 = local_a8;
          } while (iVar17 < iVar2);
        }
      }
      else {
        if (local_84 == 0) {
          bVar1 = true;
        }
        else {
          local_cc = **(int **)((long)pvVar12 + 8);
          printf("%6d %6d %6d : ",lVar22,(ulong)*(uint *)((long)pvVar12 + 4));
          pGVar6 = Gia_ManDupCones(pGVar6,&local_cc,1,1);
          Gia_ManPrintStats(pGVar6,(Gps_Par_t *)0x0);
          Gia_ManStop(pGVar6);
          bVar1 = 0 < *(int *)((long)pvVar12 + 4);
        }
        puVar11 = (uint *)malloc(0x10);
        puVar11[0] = 100;
        puVar11[1] = 0;
        pvVar12 = malloc(800);
        *(void **)(puVar11 + 2) = pvVar12;
        uVar23 = local_b8;
        if (bVar1) {
          uVar3 = 0;
          local_40 = (ulong)local_e0;
          lVar22 = 0;
          uVar18 = 100;
          local_90 = puVar11;
          do {
            local_cc = *(int *)(*(long *)((long)local_70 + 8) + lVar22 * 4);
            iVar2 = local_dc * -0x3d70a3d7;
            local_dc = local_dc + 1;
            uVar19 = iVar2 + 0xc7ae1479;
            if ((uVar19 >> 2 | uVar19 * 0x40000000) < 0x28f5c29) {
              printf("%6d finished...\r",(ulong)local_dc);
            }
            local_b8 = uVar23;
            local_68 = uVar18;
            if (ppVVar21 == (Vec_Ptr_t **)0x0) {
              pvPiPerm = (Vec_Int_t **)0x0;
            }
            else {
              if ((*ppVVar21)->pArray[local_cc] != (void *)0x0) {
                __assert_fail("pvPiPerms == NULL || Vec_PtrArray(*pvPiPerms)[iPo] == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIso.c"
                              ,0x480,
                              "Gia_Man_t *Gia_ManIsoReduce(Gia_Man_t *, Vec_Ptr_t **, Vec_Ptr_t **, int, int, int, int)"
                             );
              }
              pvPiPerm = (Vec_Int_t **)((*ppVVar21)->pArray + local_cc);
            }
            uVar23 = (ulong)uVar3;
            uVar18 = 0;
            __ptr = Gia_ManIsoFindString(local_c0,local_cc,0,pvPiPerm);
            if ((int)uVar3 < 1) {
LAB_0075aca2:
              uVar19 = (uint)uVar18;
              if (uVar19 == uVar3) goto LAB_0075aca8;
              if (__ptr->pArray != (char *)0x0) {
                free(__ptr->pArray);
              }
              free(__ptr);
              ppVVar21 = local_a0;
            }
            else {
              lVar24 = *(long *)(local_90 + 2);
              uVar18 = 0;
              do {
                lVar20 = *(long *)(lVar24 + uVar18 * 8);
                if ((__ptr == (Vec_Str_t *)0x0) || (lVar20 == 0)) {
                  iVar2 = ((__ptr != (Vec_Str_t *)0x0) - 1) + (uint)(lVar20 == 0);
                }
                else {
                  iVar2 = __ptr->nSize;
                  if (iVar2 == *(int *)(lVar20 + 4)) {
                    iVar2 = memcmp(__ptr->pArray,*(void **)(lVar20 + 8),(long)iVar2);
                  }
                  else {
                    iVar2 = iVar2 - *(int *)(lVar20 + 4);
                  }
                }
                pVVar8 = local_c8;
                if (iVar2 == 0) goto LAB_0075aca2;
                uVar18 = uVar18 + 1;
                uVar19 = uVar3;
              } while (uVar23 != uVar18);
LAB_0075aca8:
              puVar11 = local_90;
              uVar15 = (uint)local_68;
              if (uVar3 == uVar15) {
                if (uVar15 < 0x10) {
                  if (*(void **)(local_90 + 2) == (void *)0x0) {
                    pvVar12 = malloc(0x80);
                  }
                  else {
                    pvVar12 = realloc(*(void **)(local_90 + 2),0x80);
                  }
                  *(void **)(puVar11 + 2) = pvVar12;
                  *puVar11 = 0x10;
                  uVar18 = 0x10;
                }
                else {
                  uVar15 = uVar15 * 2;
                  sVar26 = (ulong)uVar15 * 8;
                  if (*(void **)(local_90 + 2) == (void *)0x0) {
                    pvVar12 = malloc(sVar26);
                  }
                  else {
                    pvVar12 = realloc(*(void **)(local_90 + 2),sVar26);
                  }
                  *(void **)(local_90 + 2) = pvVar12;
                  *local_90 = uVar15;
                  puVar11 = local_90;
                  uVar18 = (ulong)uVar15;
                }
              }
              else {
                pvVar12 = *(void **)(local_90 + 2);
                uVar18 = local_68;
              }
              uVar3 = uVar3 + 1;
              puVar11[1] = uVar3;
              *(Vec_Str_t **)((long)pvVar12 + uVar23 * 8) = __ptr;
              puVar13 = (undefined8 *)malloc(0x10);
              *puVar13 = 0x10;
              pvVar12 = malloc(0x40);
              ppVVar21 = local_a0;
              puVar13[1] = pvVar12;
              iVar2 = (int)local_98;
              local_68 = uVar18;
              if ((int)local_40 == iVar2) {
                if (iVar2 < 0x10) {
                  if (pVVar8->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar5 = (void **)realloc(pVVar8->pArray,0x80);
                  }
                  pVVar8->pArray = ppvVar5;
                  pVVar8->nCap = 0x10;
                  local_a8 = 0x10;
                  local_98 = 0x10;
                }
                else {
                  local_98 = (ulong)(uint)(iVar2 * 2);
                  if (pVVar8->pArray == (void **)0x0) {
                    ppvVar5 = (void **)malloc(local_98 * 8);
                  }
                  else {
                    ppvVar5 = (void **)realloc(pVVar8->pArray,local_98 * 8);
                  }
                  pVVar8->pArray = ppvVar5;
                  pVVar8->nCap = (int)local_98;
                  local_a8 = local_98;
                }
              }
              else {
                ppvVar5 = pVVar8->pArray;
              }
              uVar15 = (int)local_40 + 1;
              local_b8 = (ulong)uVar15;
              pVVar8->nSize = uVar15;
              ppvVar5[(int)local_40] = puVar13;
            }
            uVar23 = local_b8;
            uVar19 = uVar19 + local_e0;
            if (((int)uVar19 < 0) || (uVar15 = (uint)local_b8, (int)uVar15 <= (int)uVar19)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            Vec_IntPush((Vec_Int_t *)pVVar8->pArray[uVar19],local_cc);
            puVar11 = local_90;
            lVar22 = lVar22 + 1;
            local_40 = uVar23 & 0xffffffff;
            uVar18 = local_68;
          } while (lVar22 < *(int *)((long)local_70 + 4));
          pvVar12 = *(void **)(local_90 + 2);
          pVVar4 = local_78;
          local_e0 = uVar15;
          if ((int)uVar3 < 1) goto LAB_0075af28;
          uVar18 = 0;
          do {
            pvVar10 = *(void **)((long)pvVar12 + uVar18 * 8);
            if (pvVar10 != (void *)0x0) {
              if (*(void **)((long)pvVar10 + 8) != (void *)0x0) {
                free(*(void **)((long)pvVar10 + 8));
              }
              free(pvVar10);
            }
            uVar18 = uVar18 + 1;
          } while (uVar3 != uVar18);
          local_e0 = (uint)local_b8;
          uVar23 = local_b8;
          pVVar4 = local_78;
          ppVVar21 = local_a0;
LAB_0075af2d:
          free(pvVar12);
        }
        else {
LAB_0075af28:
          if (pvVar12 != (void *)0x0) goto LAB_0075af2d;
        }
        free(puVar11);
        uVar18 = local_98;
      }
      local_98 = uVar18;
      lVar22 = local_38 + 1;
      uVar18 = (ulong)pVVar4->nSize;
      uVar23 = uVar23 & 0xffffffff;
    } while (lVar22 < (long)uVar18);
  }
  if (local_dc != local_c0->vCos->nSize - local_c0->nRegs) {
    __assert_fail("Counter == Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIso.c"
                  ,0x499,
                  "Gia_Man_t *Gia_ManIsoReduce(Gia_Man_t *, Vec_Ptr_t **, Vec_Ptr_t **, int, int, int, int)"
                 );
  }
  iVar2 = pVVar8->nSize;
  ppvVar5 = pVVar8->pArray;
  qsort(ppvVar5,(long)iVar2,8,Vec_VecSortCompare3);
  if (0 < (int)uVar18) {
    uVar23 = 0;
    do {
      pvVar12 = pVVar4->pArray[uVar23];
      if (pvVar12 != (void *)0x0) {
        if (*(void **)((long)pvVar12 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar12 + 8));
        }
        free(pvVar12);
      }
      uVar23 = uVar23 + 1;
    } while ((uVar18 & 0xffffffff) != uVar23);
  }
  if (pVVar4->pArray != (void **)0x0) {
    free(pVVar4->pArray);
  }
  free(pVVar4);
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar9 = (int *)malloc(400);
  lVar22 = local_48;
  p->pArray = piVar9;
  if (0 < iVar2) {
    lVar24 = 0;
    do {
      pvVar12 = ppvVar5[lVar24];
      if (*(int *)((long)pvVar12 + 4) < 1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(p,**(int **)((long)pvVar12 + 8));
      lVar24 = lVar24 + 1;
    } while (lVar24 < iVar2);
  }
  pGVar6 = local_c0;
  if (local_ac != 0) {
    uVar3 = p->nSize;
    p_00 = (Vec_Int_t *)malloc(0x10);
    uVar19 = 0x10;
    if (0xe < uVar3 - 1) {
      uVar19 = uVar3;
    }
    p_00->nSize = 0;
    p_00->nCap = uVar19;
    if (uVar19 == 0) {
      piVar9 = (int *)0x0;
    }
    else {
      piVar9 = (int *)malloc((long)(int)uVar19 << 2);
    }
    p_00->pArray = piVar9;
    piVar9 = p->pArray;
    if ((int)uVar3 < 1) {
      if (piVar9 != (int *)0x0) goto LAB_0075b182;
    }
    else {
      uVar18 = 0;
      do {
        iVar2 = piVar9[uVar18];
        Vec_IntPush(p_00,iVar2 * 2);
        Vec_IntPush(p_00,iVar2 * 2 + 1);
        uVar18 = uVar18 + 1;
      } while (uVar3 != uVar18);
LAB_0075b182:
      free(piVar9);
    }
    free(p);
    Gia_ManStop(local_c0);
    pGVar6 = local_50;
    lVar22 = local_48;
    p = p_00;
  }
  uVar18 = 0;
  pGVar7 = Gia_ManDupCones(pGVar6,p->pArray,p->nSize,0);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
  }
  free(p);
  uVar3 = local_c8->nSize;
  uVar25 = (ulong)(int)uVar3;
  uVar23 = 0;
  if (0 < (long)uVar25) {
    uVar18 = 0;
    uVar19 = 0;
    uVar16 = 0;
    uVar23 = 0;
    do {
      iVar2 = *(int *)((long)local_c8->pArray[uVar16] + 4);
      if (1 < iVar2) {
        uVar18 = (ulong)(iVar2 + uVar19);
        uVar19 = iVar2 + uVar19;
      }
      uVar23 = (ulong)((int)uVar23 + (uint)(1 < iVar2));
      uVar16 = uVar16 + 1;
    } while (uVar25 != uVar16);
  }
  uVar19 = pGVar6->vCos->nSize - pGVar6->nRegs;
  if (local_ac == 0) {
    printf("Reduced %d outputs to %d equivalence classes (%d outputs are in %d non-trivial classes).  "
           ,(ulong)uVar19,(ulong)uVar3,uVar18,uVar23);
  }
  else {
    uVar15 = pGVar7->vCos->nSize - pGVar7->nRegs;
    printf("Reduced %d dual outputs to %d dual outputs.  ",(ulong)(uint)((int)uVar19 / 2),
           (ulong)(uint)((int)uVar15 / 2),(ulong)uVar15,uVar23);
  }
  iVar17 = 3;
  iVar2 = clock_gettime(3,&local_60);
  if (iVar2 < 0) {
    lVar24 = -1;
  }
  else {
    lVar24 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  Abc_Print(iVar17,"%s =","Time");
  Abc_Print(iVar17,"%9.2f sec\n",(double)(lVar24 - lVar22) / 1000000.0);
  if (local_84 == 0) {
LAB_0075b3bf:
    pVVar4 = local_c8;
    if (local_80 != (Vec_Ptr_t **)0x0) {
LAB_0075b412:
      *local_80 = local_c8;
      return pGVar7;
    }
    ppvVar5 = local_c8->pArray;
    if ((int)uVar3 < 1) goto LAB_0075b42a;
    uVar18 = 0;
    do {
      pvVar12 = ppvVar5[uVar18];
      if (pvVar12 != (void *)0x0) {
        if (*(void **)((long)pvVar12 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar12 + 8));
        }
        free(pvVar12);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < uVar25);
  }
  else {
    puts("Nontrivial classes:");
    if (0 < (int)uVar3) {
      uVar18 = 0;
      do {
        if (uVar25 <= uVar18) {
LAB_0075b478:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                        ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
        }
        ppvVar5 = local_c8->pArray;
        pvVar12 = ppvVar5[uVar18];
        uVar23 = (ulong)*(uint *)((long)pvVar12 + 4);
        if (0 < (int)*(uint *)((long)pvVar12 + 4)) {
          uVar16 = 0;
          do {
            if ((int)uVar23 == 1) break;
            uVar19 = *(uint *)(*(long *)((long)pvVar12 + 8) + uVar16 * 4);
            if (uVar16 == 0) {
              printf(" %4d : {",uVar18 & 0xffffffff);
            }
            printf(" %d",(ulong)uVar19);
            if (uVar16 == *(int *)((long)ppvVar5[uVar18] + 4) - 1) {
              puts(" }");
            }
            if (uVar25 <= uVar18) goto LAB_0075b478;
            uVar16 = uVar16 + 1;
            pvVar12 = ppvVar5[uVar18];
            uVar23 = (ulong)*(int *)((long)pvVar12 + 4);
          } while ((long)uVar16 < (long)uVar23);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < uVar25);
      goto LAB_0075b3bf;
    }
    if (local_80 != (Vec_Ptr_t **)0x0) goto LAB_0075b412;
    ppvVar5 = local_c8->pArray;
LAB_0075b42a:
    pVVar4 = local_c8;
    if (ppvVar5 == (void **)0x0) goto LAB_0075b43c;
  }
  free(ppvVar5);
LAB_0075b43c:
  free(pVVar4);
  return pGVar7;
}

Assistant:

Gia_Man_t * Gia_ManIsoReduce( Gia_Man_t * pInit, Vec_Ptr_t ** pvPosEquivs, Vec_Ptr_t ** pvPiPerms, int fEstimate, int fDualOut, int fVerbose, int fVeryVerbose )
{ 
    Gia_Man_t * p, * pPart;
    Vec_Ptr_t * vEquivs, * vEquivs2, * vStrings;
    Vec_Int_t * vRemain, * vLevel, * vLevel2;
    Vec_Str_t * vStr, * vStr2;
    int i, k, s, sStart, iPo, Counter;
    int nClasses, nUsedPos;
    abctime clk = Abc_Clock();
    if ( pvPosEquivs )
        *pvPosEquivs = NULL;
    if ( pvPiPerms )
        *pvPiPerms = Vec_PtrStart( Gia_ManPoNum(pInit) );

    if ( fDualOut )
    {
        assert( (Gia_ManPoNum(pInit) & 1) == 0 );
        if ( Gia_ManPoNum(pInit) == 2 )
            return Gia_ManDup(pInit);
        p = Gia_ManTransformMiter( pInit );
        p = Gia_ManSeqStructSweep( pPart = p, 1, 1, 0 );
        Gia_ManStop( pPart );
    }
    else
    {
        if ( Gia_ManPoNum(pInit) == 1 )
            return Gia_ManDup(pInit);
        p = pInit;
    }

    // create preliminary equivalences
    vEquivs = Gia_IsoDeriveEquivPos( p, 1, fVeryVerbose );
    if ( vEquivs == NULL )
    {
        if ( fDualOut )
            Gia_ManStop( p );
        return NULL;
    }
    nClasses = Vec_IntCountNonTrivial( vEquivs, &nUsedPos );
    printf( "Reduced %d outputs to %d candidate   classes (%d outputs are in %d non-trivial classes).  ", 
        Gia_ManPoNum(p), Vec_PtrSize(vEquivs), nUsedPos, nClasses );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fEstimate )
    {
        Vec_VecFree( (Vec_Vec_t *)vEquivs );
        return Gia_ManDup(pInit);
    }

    // perform refinement of equivalence classes
    Counter = 0;
    vEquivs2 = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Vec_Int_t *, vEquivs, vLevel, i )
    {
        if ( Vec_IntSize(vLevel) < 2 )
        {
            Vec_PtrPush( vEquivs2, Vec_IntDup(vLevel) );
            for ( k = 0; k < Vec_IntSize(vLevel); k++ )
                if ( ++Counter % 100 == 0 )
                    printf( "%6d finished...\r", Counter );
            continue;
        }

        if ( fVerbose )
        {
            iPo = Vec_IntEntry(vLevel, 0);
            printf( "%6d %6d %6d : ", i, Vec_IntSize(vLevel), iPo );
            pPart = Gia_ManDupCones( p, &iPo, 1, 1 );
            Gia_ManPrintStats(pPart, NULL);
            Gia_ManStop( pPart );
        }

        sStart = Vec_PtrSize( vEquivs2 ); 
        vStrings = Vec_PtrAlloc( 100 );
        Vec_IntForEachEntry( vLevel, iPo, k )
        {
            if ( ++Counter % 100 == 0 )
                printf( "%6d finished...\r", Counter );
            assert( pvPiPerms == NULL || Vec_PtrArray(*pvPiPerms)[iPo] == NULL );
            vStr = Gia_ManIsoFindString( p, iPo, 0, pvPiPerms ? (Vec_Int_t **)Vec_PtrArray(*pvPiPerms) + iPo : NULL );

//            printf( "Output %2d : ", iPo );
//            Vec_IntPrint( Vec_PtrArray(*pvPiPerms)[iPo] );

            // check if this string already exists
            Vec_PtrForEachEntry( Vec_Str_t *, vStrings, vStr2, s )
                if ( Vec_StrCompareVec(vStr, vStr2) == 0 )
                    break;
            if ( s == Vec_PtrSize(vStrings) )
            {
                Vec_PtrPush( vStrings, vStr );
                Vec_PtrPush( vEquivs2, Vec_IntAlloc(8) );
            }
            else
                Vec_StrFree( vStr );
            // add this entry to the corresponding level
            vLevel2 = (Vec_Int_t *)Vec_PtrEntry( vEquivs2, sStart + s );
            Vec_IntPush( vLevel2, iPo );
        }
//        if ( Vec_PtrSize(vEquivs2) - sStart > 1 )
//            printf( "Refined class %d into %d classes.\n", i, Vec_PtrSize(vEquivs2) - sStart );
        Vec_VecFree( (Vec_Vec_t *)vStrings );
    }
    assert( Counter == Gia_ManPoNum(p) );
    Vec_VecSortByFirstInt( (Vec_Vec_t *)vEquivs2, 0 );
    Vec_VecFree( (Vec_Vec_t *)vEquivs );
    vEquivs = vEquivs2;

    // collect the first ones
    vRemain = Vec_IntAlloc( 100 );
    Vec_PtrForEachEntry( Vec_Int_t *, vEquivs, vLevel, i )
        Vec_IntPush( vRemain, Vec_IntEntry(vLevel, 0) );

    if ( fDualOut )
    {
        Vec_Int_t * vTemp = Vec_IntAlloc( Vec_IntSize(vRemain) );
        int i, Entry;
        Vec_IntForEachEntry( vRemain, Entry, i )
        {
//            printf( "%d ", Entry );
            Vec_IntPush( vTemp, 2*Entry );
            Vec_IntPush( vTemp, 2*Entry+1 );
        }
//        printf( "\n" );
        Vec_IntFree( vRemain );
        vRemain = vTemp;
        Gia_ManStop( p );
        p = pInit;
    }


    // derive the resulting AIG
    pPart = Gia_ManDupCones( p, Vec_IntArray(vRemain), Vec_IntSize(vRemain), 0 );
    Vec_IntFree( vRemain );
    // report the results
    nClasses = Vec_IntCountNonTrivial( vEquivs, &nUsedPos );
    if ( !fDualOut )
        printf( "Reduced %d outputs to %d equivalence classes (%d outputs are in %d non-trivial classes).  ", 
            Gia_ManPoNum(p), Vec_PtrSize(vEquivs), nUsedPos, nClasses );
    else
        printf( "Reduced %d dual outputs to %d dual outputs.  ", Gia_ManPoNum(p)/2, Gia_ManPoNum(pPart)/2 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVerbose )
    {
        printf( "Nontrivial classes:\n" );
        Vec_VecPrintInt( (Vec_Vec_t *)vEquivs, 1 );
    }
    if ( pvPosEquivs )
        *pvPosEquivs = vEquivs;
    else
        Vec_VecFree( (Vec_Vec_t *)vEquivs );
//    Gia_ManStopP( &pPart );
    return pPart;
}